

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

void lydict_clean(ly_dict *dict)

{
  uint32_t local_28;
  uint local_24;
  uint32_t rec_idx;
  uint32_t hlist_idx;
  ly_ht_rec *rec;
  ly_dict_rec *dict_rec;
  ly_dict *dict_local;
  
  if (dict == (ly_dict *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","dict","lydict_clean");
  }
  else {
    for (local_24 = 0; local_24 < dict->hash_tab->size; local_24 = local_24 + 1) {
      local_28 = dict->hash_tab->hlists[local_24].first;
      _rec_idx = lyht_get_rec(dict->hash_tab->recs,dict->hash_tab->rec_size,local_28);
      while (local_28 != 0xffffffff) {
        ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
               "String \"%s\" not freed from the dictionary, refcount %u.",
               *(undefined8 *)_rec_idx->val,(ulong)*(uint *)((long)&_rec_idx[1].next + 3));
        local_28 = _rec_idx->next;
        _rec_idx = lyht_get_rec(dict->hash_tab->recs,dict->hash_tab->rec_size,local_28);
      }
    }
    lyht_free(dict->hash_tab,(_func_void_void_ptr *)0x0);
    pthread_mutex_destroy((pthread_mutex_t *)&dict->lock);
  }
  return;
}

Assistant:

void
lydict_clean(struct ly_dict *dict)
{
    struct ly_dict_rec *dict_rec = NULL;
    struct ly_ht_rec *rec = NULL;
    uint32_t hlist_idx;
    uint32_t rec_idx;

    LY_CHECK_ARG_RET(NULL, dict, );

    LYHT_ITER_ALL_RECS(dict->hash_tab, hlist_idx, rec_idx, rec) {
        /*
         * this should not happen, all records inserted into
         * dictionary are supposed to be removed using lydict_remove()
         * before calling lydict_clean()
         */
        dict_rec = (struct ly_dict_rec *)rec->val;
        LOGWRN(NULL, "String \"%s\" not freed from the dictionary, refcount %" PRIu32 ".", dict_rec->value, dict_rec->refcount);
        /* if record wasn't removed before free string allocated for that record */
#ifdef NDEBUG
        free(dict_rec->value);
#endif
    }

    /* free table and destroy mutex */
    lyht_free(dict->hash_tab, NULL);
    pthread_mutex_destroy(&dict->lock);
}